

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_zstd.c
# Opt level: O3

void test_option_zstd(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char *__haystack;
  char *pcVar3;
  size_t s;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_zstd.c"
                      ,L'\x10',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("echo f | %s -o --zstd >archive.out 2>archive.err",testprog);
  __haystack = slurpfile(&s,"archive.err");
  __haystack[s] = '\0';
  if (wVar1 == L'\0') {
    free(__haystack);
    __haystack = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_zstd.c"
                     ,L'=',(uint)(2 < s),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_zstd.c"
                        ,L'>',__haystack,"p",anon_var_dwarf_16501,"\"\\x28\\xb5\\x2f\\xfd\"",4,"4",
                        (void *)0x0);
  }
  else {
    pcVar3 = strstr(__haystack,"Unsupported compression");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strstr(__haystack,"Can\'t launch");
      if ((pcVar3 == (char *)0x0) || (wVar2 = canZstd(), wVar2 != L'\0')) {
        pcVar3 = strstr(__haystack,"Can\'t write");
        if ((pcVar3 == (char *)0x0) || (wVar2 = canZstd(), wVar2 != L'\0')) {
          pcVar3 = strstr(__haystack,"Error closing");
          if ((pcVar3 != (char *)0x0) && (wVar2 = canZstd(), wVar2 == L'\0')) {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_zstd.c"
                           ,L'2');
            test_skipping(
                         "This version of bsdcpio uses an external zstd program but no such program is available on this system."
                         );
            return;
          }
          failure("--zstd option is broken: %s",__haystack);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_zstd.c"
                              ,L'7',(long)wVar1,"r",0,"0",(void *)0x0);
          goto LAB_0010f6df;
        }
        wVar1 = L'+';
      }
      else {
        wVar1 = L'\"';
      }
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_zstd.c"
                     ,wVar1);
      pcVar3 = 
      "This version of bsdcpio uses an external zstd program but no such program is available on this system."
      ;
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_zstd.c"
                     ,L'\x19');
      pcVar3 = "This version of bsdcpio was compiled without zstd support";
    }
    test_skipping(pcVar3);
  }
LAB_0010f6df:
  free(__haystack);
  return;
}

Assistant:

DEFINE_TEST(test_option_zstd)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with zstd compression. */
	r = systemf("echo f | %s -o --zstd >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "Unsupported compression") != NULL) {
			skipping("This version of bsdcpio was compiled "
			    "without zstd support");
			goto done;
		}
		/* POSIX permits different handling of the spawnp
		 * system call used to launch the subsidiary
		 * program: */
		/* Some systems fail immediately to spawn the new process. */
		if (strstr(p, "Can't launch") != NULL && !canZstd()) {
			skipping("This version of bsdcpio uses an external zstd program "
			    "but no such program is available on this system.");
			goto done;
		}
		/* Some systems successfully spawn the new process,
		 * but fail to exec a program within that process.
		 * This results in failure at the first attempt to
		 * write. */
		if (strstr(p, "Can't write") != NULL && !canZstd()) {
			skipping("This version of bsdcpio uses an external zstd program "
			    "but no such program is available on this system.");
			goto done;
		}
		/* On some systems the error won't be detected until closing
		   time, by a 127 exit error returned by waitpid. */
		if (strstr(p, "Error closing") != NULL && !canZstd()) {
			skipping("This version of bsdcpio uses an external zstd program "
			    "but no such program is available on this system.");
			return;
		}
		failure("--zstd option is broken: %s", p);
		assertEqualInt(r, 0);
		goto done;
	}
	free(p);
	/* Check that the archive file has an zstd signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\x28\xb5\x2f\xfd", 4);

done:
	free(p);
}